

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdlib.cpp
# Opt level: O0

void DefaultExtension(char *path,char *extension)

{
  bool bVar1;
  size_t sVar2;
  byte local_29;
  char *local_20;
  char *src;
  char *extension_local;
  char *path_local;
  
  sVar2 = strlen(path);
  local_20 = path + sVar2;
  while( true ) {
    local_20 = local_20 + -1;
    local_29 = 0;
    if (local_20 != path) {
      bVar1 = IsSeperator((int)*local_20);
      local_29 = bVar1 ^ 0xff;
    }
    if ((local_29 & 1) == 0) break;
    if (*local_20 == '.') {
      return;
    }
  }
  strcat(path,extension);
  return;
}

Assistant:

void DefaultExtension (char *path, const char *extension)
{
	char *src;
//
// if path doesn't have a .EXT, append extension
// (extension should include the .)
//
	src = path + strlen(path) - 1;

	while (src != path && !IsSeperator(*src))
	{
		if (*src == '.')
			return;                 // it has an extension
		src--;
	}

	strcat (path, extension);
}